

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::solver_equalities_101coeff
          (solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pmVar2;
  pointer pfVar3;
  byte bVar4;
  bool bVar5;
  double *pdVar6;
  int *__s;
  rc_data *__s_00;
  bound_factor *__s_01;
  undefined8 extraout_RAX;
  long lVar7;
  ulong uVar8;
  pointer pfVar9;
  int *piVar10;
  int iVar11;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar12;
  ulong uVar13;
  sparse_matrix<int> *this_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  pvVar12 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar13 = (ulong)(this->ap).m_rows_values.m_length;
  uVar8 = uVar13 * 8;
  pdVar6 = (double *)operator_new__(uVar8);
  memset(pdVar6,0,uVar8);
  uVar13 = uVar13 << 2;
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar6;
  __s = (int *)operator_new__(uVar13);
  memset(__s,0,uVar13);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  pmVar2 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2;
  uVar8 = (long)*(pointer *)
                 ((long)&(pmVar2->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar2->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  if (lVar7 != 0x28) {
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar21 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar22 = vpbroadcastq_avx512f();
    do {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vmovdqa64_avx512f(auVar21);
      vpmullq_avx512dq(auVar17,auVar19);
      uVar8 = uVar8 + 8;
      auVar17 = vpaddq_avx512f(auVar17,auVar20);
      auVar21 = vporq_avx512f(auVar23,auVar18);
      uVar13 = vpcmpuq_avx512f(auVar21,auVar22,2);
      auVar21 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar2->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar12));
      bVar4 = (byte)uVar13;
      auVar23._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar21._8_8_;
      auVar23._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
      auVar23._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar21._16_8_;
      auVar23._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar21._24_8_;
      auVar23._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar21._32_8_;
      auVar23._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar21._40_8_;
      auVar23._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar21._48_8_;
      auVar23._56_8_ = (uVar13 >> 7) * auVar21._56_8_;
      auVar21 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar12->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar2->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar25._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar21._8_8_;
      auVar25._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
      auVar25._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar21._16_8_;
      auVar25._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar21._24_8_;
      auVar25._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar21._32_8_;
      auVar25._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar21._40_8_;
      auVar25._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar21._48_8_;
      auVar25._56_8_ = (uVar13 >> 7) * auVar21._56_8_;
      auVar21 = vpsubq_avx512f(auVar23,auVar25);
      auVar21 = vpsraq_avx512f(auVar21,3);
      auVar21 = vpmaxuq_avx512f(auVar24,auVar21);
    } while (((lVar7 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar8);
    auVar17 = vmovdqa64_avx512f(auVar21);
    auVar18._0_8_ = (ulong)(bVar4 & 1) * auVar17._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar24._0_8_;
    bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar18._8_8_ = (ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * auVar24._8_8_;
    bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar18._16_8_ = (ulong)bVar5 * auVar17._16_8_ | (ulong)!bVar5 * auVar24._16_8_;
    bVar5 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar18._24_8_ = (ulong)bVar5 * auVar17._24_8_ | (ulong)!bVar5 * auVar24._24_8_;
    bVar5 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar18._32_8_ = (ulong)bVar5 * auVar17._32_8_ | (ulong)!bVar5 * auVar24._32_8_;
    bVar5 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar18._40_8_ = (ulong)bVar5 * auVar17._40_8_ | (ulong)!bVar5 * auVar24._40_8_;
    bVar5 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar18._48_8_ = (ulong)bVar5 * auVar17._48_8_ | (ulong)!bVar5 * auVar24._48_8_;
    auVar18._56_8_ = (uVar13 >> 7) * auVar17._56_8_ | (ulong)!SUB81(uVar13 >> 7,0) * auVar24._56_8_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpmaxuq_avx512f(auVar18,ZEXT3264(auVar16));
    auVar14 = vpmaxuq_avx512vl(auVar17._0_16_,auVar17._16_16_);
    auVar15 = vpshufd_avx(auVar14,0xee);
    auVar15 = vpmaxuq_avx512vl(auVar14,auVar15);
    uVar8 = auVar15._0_8_;
  }
  uVar8 = -(ulong)(uVar8 >> 0x3c != 0) | uVar8 << 4;
  __s_00 = (rc_data *)operator_new__(uVar8);
  memset(__s_00,0,uVar8);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
  ._M_head_impl = __s_00;
  uVar8 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar8 = (ulong)(uint)m_ * 8;
  }
  __s_01 = (bound_factor *)operator_new__(uVar8);
  memset(__s_01,0,uVar8);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
  ._M_head_impl = __s_01;
  pdVar6 = (double *)operator_new__(uVar8);
  this_00 = (sparse_matrix<int> *)0x0;
  memset(pdVar6,0,uVar8);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar6;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    uVar8 = 0;
    pmVar2 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      __s_01[uVar8].negative_factor = 0;
      pmVar1 = pmVar2 + uVar8;
      iVar11 = pmVar1->min;
      __s_01[uVar8].value = iVar11;
      pfVar9 = *(pointer *)
                &(pmVar1->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      pfVar3 = *(pointer *)
                ((long)&(pmVar1->elements).
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar9 != pfVar3) {
        iVar11 = 0;
        piVar10 = __s + (int)this_00;
        do {
          if ((pfVar9->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_002f18c0;
          }
          *piVar10 = pfVar9->factor;
          if (pfVar9->factor < 0) {
            iVar11 = iVar11 + 1;
            __s_01[uVar8].negative_factor = iVar11;
          }
          pfVar9 = pfVar9 + 1;
          piVar10 = piVar10 + 1;
          this_00 = (sparse_matrix<int> *)(ulong)((int)this_00 + 1);
        } while (pfVar9 != pfVar3);
        iVar11 = pmVar1->min;
      }
      if (iVar11 != pmVar1->max) {
LAB_002f18c0:
        itm::solver_equalities_101coeff();
        operator_delete__(__s_01);
        __s[0x1a] = 0;
        __s[0x1b] = 0;
        if (*(void **)(__s + 0x18) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x18));
        }
        __s[0x18] = 0;
        __s[0x19] = 0;
        if (*(void **)(__s + 0x16) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x16));
        }
        __s[0x16] = 0;
        __s[0x17] = 0;
        if (*(void **)(__s + 0x14) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x14));
        }
        __s[0x14] = 0;
        __s[0x15] = 0;
        sparse_matrix<int>::~sparse_matrix(this_00);
        _Unwind_Resume(extraout_RAX);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }